

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileByName
          (EncodedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  DescriptorIndex<std::pair<const_void_*,_int>_> *in_RDX;
  void *in_RDI;
  pair<const_void_*,_int> pVar2;
  EncodedDescriptorDatabase *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pVar2 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindFile
                    (in_RDX,(string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  pVar2._8_8_ = pVar2.first;
  pVar2.first = in_RDI;
  bVar1 = MaybeParse(in_stack_ffffffffffffffb8,pVar2,(FileDescriptorProto *)0x52fb7e);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileByName(const std::string& filename,
                                               FileDescriptorProto* output) {
  return MaybeParse(index_.FindFile(filename), output);
}